

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XercesDOMParser.cpp
# Opt level: O0

void __thiscall
xercesc_4_0::XercesDOMParser::setXMLEntityResolver(XercesDOMParser *this,XMLEntityResolver *handler)

{
  XMLScanner *pXVar1;
  XMLEntityResolver *handler_local;
  XercesDOMParser *this_local;
  
  this->fXMLEntityResolver = handler;
  if (this->fXMLEntityResolver == (XMLEntityResolver *)0x0) {
    pXVar1 = AbstractDOMParser::getScanner(&this->super_AbstractDOMParser);
    XMLScanner::setEntityHandler(pXVar1,(XMLEntityHandler *)0x0);
  }
  else {
    pXVar1 = AbstractDOMParser::getScanner(&this->super_AbstractDOMParser);
    XMLScanner::setEntityHandler(pXVar1,&(this->super_AbstractDOMParser).super_XMLEntityHandler);
    this->fEntityResolver = (EntityResolver *)0x0;
  }
  return;
}

Assistant:

void XercesDOMParser::setXMLEntityResolver(XMLEntityResolver* const handler)
{
    fXMLEntityResolver = handler;
    if (fXMLEntityResolver) {
        getScanner()->setEntityHandler(this);
        fEntityResolver = 0;
    }
    else {
        getScanner()->setEntityHandler(0);
    }
}